

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void direct_partition_merging
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  AV1_COMMON *cm;
  char cVar1;
  byte bVar2;
  MOTION_MODE MVar3;
  short sVar4;
  uint32_t uVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *pMVar9;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  MV_REFERENCE_FRAME ref0;
  MACROBLOCKD *xd;
  ThreadData_conflict *pTVar10;
  PARTITION_TYPE PVar11;
  BLOCK_SIZE BVar12;
  bool bVar13;
  uint8_t ref_frame_type;
  BLOCK_SIZE BVar14;
  TX_SIZE TVar15;
  ushort uVar16;
  int iVar17;
  int_mv (*paiVar18) [8];
  scale_factors *sf;
  YV12_BUFFER_CONFIG *src;
  uint skip;
  long lVar19;
  ushort uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  undefined4 in_register_00000084;
  int y;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  _Bool *in_stack_fffffffffffff948;
  bool local_6aa;
  _Bool use_scaled_ref;
  MB_MODE_INFO_EXT *local_6a8;
  uint local_69c;
  undefined8 local_698;
  MACROBLOCKD *local_690;
  ThreadData_conflict *local_688;
  ulong local_680;
  ulong local_678;
  ulong local_670;
  MB_MODE_INFO *local_668;
  TileDataEnc *local_660;
  int_mv frame_mv [25] [8];
  buf_2d yv12_mb [8] [3];
  
  local_698 = CONCAT44(in_register_00000084,mi_row);
  cm = &cpi->common;
  local_69c = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bsize];
  local_688 = td;
  local_660 = tile_data;
  if ((ulong)bsize < 3) {
    PVar11 = '\0';
  }
  else {
    PVar11 = get_partition(cm,mi_row,mi_col,bsize);
  }
  BVar12 = get_partition_subsize(bsize,PVar11);
  pMVar6 = *mib;
  BVar14 = pMVar6->bsize;
  if (BVar12 <= BVar14) {
    uVar23 = local_69c >> 1;
    pMVar7 = mib[uVar23];
    if (BVar12 <= pMVar7->bsize) {
      pMVar8 = mib[(ulong)uVar23 * (long)(cpi->common).mi_params.mi_stride];
      if (((((((BVar12 <= pMVar8->bsize) &&
              (pMVar9 = (mib + (ulong)uVar23 * (long)(cpi->common).mi_params.mi_stride)[uVar23],
              BVar12 <= pMVar9->bsize)) && (pMVar6->skip_txfm != '\0')) &&
            (((pMVar7->skip_txfm != '\0' && (pMVar8->skip_txfm != '\0')) &&
             ((pMVar9->skip_txfm != '\0' &&
              ((cVar1 = pMVar6->ref_frame[1], cVar1 == pMVar7->ref_frame[1] &&
               (cVar1 == pMVar8->ref_frame[1])))))))) && (cVar1 < '\0')) &&
          ((((((cVar1 == pMVar9->ref_frame[1] &&
               (cVar1 = pMVar6->ref_frame[0], cVar1 == pMVar7->ref_frame[0])) &&
              (cVar1 == pMVar8->ref_frame[0])) &&
             (('\0' < cVar1 && (cVar1 == pMVar9->ref_frame[0])))) &&
            (bVar2 = pMVar6->mode, bVar2 == pMVar7->mode)) &&
           (((bVar2 == pMVar8->mode && ((bVar2 & 0xfd) == 0xd)) &&
            (((bVar2 == pMVar9->mode &&
              (((uVar5 = pMVar6->mv[0].as_int, uVar5 == pMVar7->mv[0].as_int &&
                (uVar5 == pMVar8->mv[0].as_int)) && (uVar5 == pMVar9->mv[0].as_int)))) &&
             (((MVar3 = pMVar6->motion_mode, MVar3 == pMVar7->motion_mode &&
               (MVar3 == pMVar8->motion_mode)) && (MVar3 == '\0' && pMVar9->motion_mode == '\0')))))
            ))))) &&
         (((uVar5 = (pMVar6->interp_filters).as_int, uVar5 == (pMVar7->interp_filters).as_int &&
           (uVar5 == (pMVar8->interp_filters).as_int)) &&
          ((uVar5 == (pMVar9->interp_filters).as_int &&
           (((uVar16 = *(ushort *)&pMVar6->field_0xa7 & 7,
             uVar16 == (*(ushort *)&pMVar7->field_0xa7 & 7) &&
             (uVar16 == (*(ushort *)&pMVar8->field_0xa7 & 7))) &&
            (uVar16 == (*(ushort *)&pMVar9->field_0xa7 & 7))))))))) {
        local_690 = &(local_688->mb).e_mbd;
        PVar11 = pMVar6->partition;
        pMVar6->bsize = bsize;
        pMVar6->partition = '\0';
        pMVar6->skip_txfm = '\x01';
        av1_set_offsets_without_segment_id
                  (cpi,&local_660->tile_info,&local_688->mb,(int)local_698,mi_col,bsize);
        cVar1 = (*mib)->ref_frame[0];
        local_6a8 = (MB_MODE_INFO_EXT *)(long)cVar1;
        paiVar18 = frame_mv;
        for (lVar19 = 0; lVar19 != 0x19; lVar19 = lVar19 + 1) {
          for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
            (*paiVar18)[lVar21].as_int = 0x80008000;
          }
          paiVar18 = paiVar18 + 1;
        }
        uVar16 = *(ushort *)(local_688->mb).color_sensitivity_sb;
        *(ushort *)(local_688->mb).color_sensitivity = uVar16;
        bVar13 = ((uVar16 & 0xff00) != 0x200 && (char)uVar16 != '\x02') &&
                 2 < (local_688->mb).nonrd_prune_ref_frame_search;
        local_678 = (ulong)bVar13;
        find_predictors(cpi,&local_688->mb,cVar1,frame_mv,yv12_mb,bsize,(uint)bVar13,
                        (int)&use_scaled_ref,in_stack_fffffffffffff948);
        pTVar10 = local_688;
        sVar4 = *(short *)((long)&yv12_mb[-4][0].buf + (long)local_6a8 * 4);
        local_668 = *mib;
        local_670 = CONCAT62(local_670._2_6_,sVar4);
        if ((sVar4 == local_668->mv[0].as_mv.row) &&
           (sVar4 = *(short *)((long)&yv12_mb[-4][0].buf + (long)local_6a8 * 4 + 2),
           local_680 = CONCAT62(local_680._2_6_,sVar4), sVar4 == local_668->mv[0].as_mv.col)) {
          sf = get_ref_scale_factors(cm,(MV_REFERENCE_FRAME)local_6a8);
          iVar17 = av1_is_scaled(sf);
          uVar16 = -(ushort)local_670;
          if (0 < (short)(ushort)local_670) {
            uVar16 = (ushort)local_670;
          }
          local_678 = CONCAT44(local_678._4_4_,iVar17);
          bVar13 = true;
          local_6aa = true;
          if ((uVar16 & 7) == 0) {
            uVar20 = -(ushort)local_680;
            if (0 < (short)(ushort)local_680) {
              uVar20 = (ushort)local_680;
            }
            local_6aa = (uVar20 & 7) != 0;
          }
          if ((uVar16 & 0xf) == 0) {
            uVar16 = -(ushort)local_680;
            if (0 < (short)(ushort)local_680) {
              uVar16 = (ushort)local_680;
            }
            bVar13 = (uVar16 & 0xf) != 0;
          }
          if ((byte)(bVar13 | local_6aa | (cpi->ppi->use_svc != 0 || iVar17 != 0)) == 1) {
            bVar13 = ((cpi->common).seq_params)->monochrome == '\0';
            local_680 = (ulong)((uint)bVar13 * 2 + 1);
            local_670 = (ulong)((uint)bVar13 * 2);
            ref0 = (MV_REFERENCE_FRAME)local_6a8;
            set_ref_ptrs(cm,local_690,ref0,local_668->ref_frame[1]);
            src = get_ref_frame_yv12_buf(cm,ref0);
            xd = local_690;
            av1_setup_pre_planes
                      (local_690,0,src,(int)local_698,mi_col,
                       (local_688->mb).e_mbd.block_ref_scale_factors[0],(int)local_680);
            av1_enc_build_inter_predictor
                      (cm,xd,(int)local_698,mi_col,(BUFFER_SET *)0x0,bsize,
                       (uint)(byte)((local_6aa | ((int)local_678 != 0 || cpi->ppi->use_svc != 0)) ^
                                   1),(int)local_670);
          }
          pTVar10 = local_688;
          local_6a8 = &(local_688->mb).mbmi_ext;
          mbmi_ext_best = (local_688->mb).mbmi_ext_frame;
          ref_frame_type = av1_ref_frame_type((*mib)->ref_frame);
          av1_copy_mbmi_ext_to_mbmi_ext_frame(mbmi_ext_best,local_6a8,ref_frame_type);
          PVar11 = (*mib)->partition;
          BVar14 = get_partition_subsize(bsize,PVar11);
          update_ext_partition_context(local_690,(int)local_698,mi_col,BVar14,bsize,PVar11);
          av1_reset_entropy_context
                    (local_690,bsize,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1)
          ;
          TVar15 = tx_size_from_tx_mode(bsize,(pTVar10->mb).txfm_search_params.tx_mode_search_type);
          pMVar6 = *mib;
          uVar23 = 0;
          if ((pTVar10->mb).e_mbd.lossless[*(ushort *)&pMVar6->field_0xa7 & 7] != 0) {
            TVar15 = '\0';
          }
          pMVar6->inter_tx_size[0xf] = TVar15;
          auVar25 = pshuflw(ZEXT216(CONCAT11(TVar15,TVar15)),ZEXT216(CONCAT11(TVar15,TVar15)),0);
          uVar24 = auVar25._0_4_;
          pMVar6->tx_size = (char)uVar24;
          pMVar6->inter_tx_size[0] = (char)((uint)uVar24 >> 8);
          pMVar6->inter_tx_size[1] = (char)((uint)uVar24 >> 0x10);
          pMVar6->inter_tx_size[2] = (char)((uint)uVar24 >> 0x18);
          *(undefined4 *)(pMVar6->inter_tx_size + 3) = uVar24;
          *(undefined4 *)(pMVar6->inter_tx_size + 7) = uVar24;
          *(undefined4 *)(pMVar6->inter_tx_size + 0xb) = uVar24;
          (pTVar10->mb).e_mbd.above_txfm_context =
               (cpi->common).above_contexts.txfm[(local_660->tile_info).tile_row] + mi_col;
          (pTVar10->mb).e_mbd.left_txfm_context =
               (pTVar10->mb).e_mbd.left_txfm_context_buffer + ((uint)local_698 & 0x1f);
          pMVar6 = *mib;
          skip = 0;
          if (pMVar6->skip_txfm != '\0') {
            if ((pMVar6->field_0xa7 & 0x80) == 0) {
              skip = (uint)('\0' < pMVar6->ref_frame[0]);
            }
            else {
              skip = 1;
            }
          }
          set_txfm_ctxs(pMVar6->tx_size,(uint)(pTVar10->mb).e_mbd.width,
                        (uint)(pTVar10->mb).e_mbd.height,skip,local_690);
          for (; uVar23 != local_69c; uVar23 = uVar23 + 1) {
            iVar17 = (cpi->common).mi_params.mi_stride;
            for (uVar22 = 0; local_69c != uVar22; uVar22 = uVar22 + 1) {
              mib[(long)(int)(iVar17 * uVar23) + uVar22] = *mib;
            }
          }
        }
        else {
          local_668->bsize = BVar14;
          local_668->partition = PVar11;
          av1_set_offsets_without_segment_id
                    (cpi,&local_660->tile_info,&local_688->mb,(int)local_698,mi_col,BVar14);
          find_predictors(cpi,&pTVar10->mb,(MV_REFERENCE_FRAME)local_6a8,frame_mv,yv12_mb,
                          (*mib)->bsize,(int)local_678,(int)&use_scaled_ref,
                          in_stack_fffffffffffff948);
        }
      }
    }
  }
  return;
}

Assistant:

static void direct_partition_merging(AV1_COMP *cpi, ThreadData *td,
                                     TileDataEnc *tile_data, MB_MODE_INFO **mib,
                                     int mi_row, int mi_col, BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  MB_MODE_INFO **b0 = mib;
  MB_MODE_INFO **b1 = mib + hbs;
  MB_MODE_INFO **b2 = mib + hbs * mi_params->mi_stride;
  MB_MODE_INFO **b3 = mib + hbs * mi_params->mi_stride + hbs;

  // Check if the following conditions are met. This can be updated
  // later with more support added.
  const int further_split = b0[0]->bsize < subsize || b1[0]->bsize < subsize ||
                            b2[0]->bsize < subsize || b3[0]->bsize < subsize;
  if (further_split) return;

  const int no_skip = !b0[0]->skip_txfm || !b1[0]->skip_txfm ||
                      !b2[0]->skip_txfm || !b3[0]->skip_txfm;
  if (no_skip) return;

  const int compound = (b0[0]->ref_frame[1] != b1[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b2[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b3[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] > NONE_FRAME);
  if (compound) return;

  // Intra modes aren't considered here.
  const int different_ref = (b0[0]->ref_frame[0] != b1[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b2[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b3[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] <= INTRA_FRAME);
  if (different_ref) return;

  const int different_mode =
      (b0[0]->mode != b1[0]->mode || b0[0]->mode != b2[0]->mode ||
       b0[0]->mode != b3[0]->mode);
  if (different_mode) return;

  const int unsupported_mode =
      (b0[0]->mode != NEARESTMV && b0[0]->mode != GLOBALMV);
  if (unsupported_mode) return;

  const int different_mv = (b0[0]->mv[0].as_int != b1[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b2[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b3[0]->mv[0].as_int);
  if (different_mv) return;

  const int unsupported_motion_mode =
      (b0[0]->motion_mode != b1[0]->motion_mode ||
       b0[0]->motion_mode != b2[0]->motion_mode ||
       b0[0]->motion_mode != b3[0]->motion_mode ||
       b0[0]->motion_mode != SIMPLE_TRANSLATION);
  if (unsupported_motion_mode) return;

  const int diffent_filter =
      (b0[0]->interp_filters.as_int != b1[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b2[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b3[0]->interp_filters.as_int);
  if (diffent_filter) return;

  const int different_seg = (b0[0]->segment_id != b1[0]->segment_id ||
                             b0[0]->segment_id != b2[0]->segment_id ||
                             b0[0]->segment_id != b3[0]->segment_id);
  if (different_seg) return;

  // Evaluate the ref_mv.
  MB_MODE_INFO **this_mi = mib;
  BLOCK_SIZE orig_bsize = this_mi[0]->bsize;
  const PARTITION_TYPE orig_partition = this_mi[0]->partition;

  this_mi[0]->bsize = bsize;
  this_mi[0]->partition = PARTITION_NONE;
  this_mi[0]->skip_txfm = 1;

  // TODO(yunqing): functions called below can be optimized by
  // removing unrelated operations.
  av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                     mi_col, bsize);

  const MV_REFERENCE_FRAME ref_frame = this_mi[0]->ref_frame[0];
  int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  int force_skip_low_temp_var = 0;
  int skip_pred_mv = 0;
  bool use_scaled_ref;

  for (int i = 0; i < MB_MODE_COUNT; ++i) {
    for (int j = 0; j < REF_FRAMES; ++j) {
      frame_mv[i][j].as_int = INVALID_MV;
    }
  }
  av1_copy(x->color_sensitivity, x->color_sensitivity_sb);
  skip_pred_mv = (x->nonrd_prune_ref_frame_search > 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] != 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] != 2);

  find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, bsize,
                  force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);

  int continue_merging = 1;
  if (frame_mv[NEARESTMV][ref_frame].as_mv.row != b0[0]->mv[0].as_mv.row ||
      frame_mv[NEARESTMV][ref_frame].as_mv.col != b0[0]->mv[0].as_mv.col)
    continue_merging = 0;

  if (!continue_merging) {
    this_mi[0]->bsize = orig_bsize;
    this_mi[0]->partition = orig_partition;

    // TODO(yunqing): Store the results and restore here instead of
    // calling find_predictors() again.
    av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                       mi_col, this_mi[0]->bsize);
    find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, this_mi[0]->bsize,
                    force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);
  } else {
    struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
    const int is_scaled = av1_is_scaled(sf);
    const int is_y_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 8) ||
                               (abs(this_mi[0]->mv[0].as_mv.col) % 8);
    const int is_uv_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 16) ||
                                (abs(this_mi[0]->mv[0].as_mv.col) % 16);

    if (cpi->ppi->use_svc || is_scaled || is_y_subpel_mv || is_uv_subpel_mv) {
      const int num_planes = av1_num_planes(cm);
      set_ref_ptrs(cm, xd, ref_frame, this_mi[0]->ref_frame[1]);
      const YV12_BUFFER_CONFIG *cfg = get_ref_frame_yv12_buf(cm, ref_frame);
      av1_setup_pre_planes(xd, 0, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[0], num_planes);

      if (!cpi->ppi->use_svc && !is_scaled && !is_y_subpel_mv) {
        assert(is_uv_subpel_mv == 1);
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 1,
                                      num_planes - 1);
      } else {
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      num_planes - 1);
      }
    }

    // Copy out mbmi_ext information.
    MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
    MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame = x->mbmi_ext_frame;
    av1_copy_mbmi_ext_to_mbmi_ext_frame(
        mbmi_ext_frame, mbmi_ext, av1_ref_frame_type(this_mi[0]->ref_frame));

    const BLOCK_SIZE this_subsize =
        get_partition_subsize(bsize, this_mi[0]->partition);
    // Update partition contexts.
    update_ext_partition_context(xd, mi_row, mi_col, this_subsize, bsize,
                                 this_mi[0]->partition);

    const int num_planes = av1_num_planes(cm);
    av1_reset_entropy_context(xd, bsize, num_planes);

    // Note: use x->txfm_search_params.tx_mode_search_type instead of
    // cm->features.tx_mode here.
    TX_SIZE tx_size =
        tx_size_from_tx_mode(bsize, x->txfm_search_params.tx_mode_search_type);
    if (xd->lossless[this_mi[0]->segment_id]) tx_size = TX_4X4;
    this_mi[0]->tx_size = tx_size;
    memset(this_mi[0]->inter_tx_size, this_mi[0]->tx_size,
           sizeof(this_mi[0]->inter_tx_size));

    // Update txfm contexts.
    xd->above_txfm_context =
        cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
    xd->left_txfm_context =
        xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
    set_txfm_ctxs(this_mi[0]->tx_size, xd->width, xd->height,
                  this_mi[0]->skip_txfm && is_inter_block(this_mi[0]), xd);

    // Update mi for this partition block.
    for (int y = 0; y < bs; y++) {
      for (int x_idx = 0; x_idx < bs; x_idx++) {
        this_mi[x_idx + y * mi_params->mi_stride] = this_mi[0];
      }
    }
  }
}